

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_format.cpp
# Opt level: O3

string * ON_std_string_format_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  ON_StringBuffer buffer;
  va_list args;
  char stack_buffer [2048];
  ON_StringBuffer local_908;
  __va_list_tag local_8e8;
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined8 local_838;
  undefined8 local_828;
  char local_818 [2056];
  
  if (in_AL != '\0') {
    local_898 = in_XMM0_Qa;
    local_888 = in_XMM1_Qa;
    local_878 = in_XMM2_Qa;
    local_868 = in_XMM3_Qa;
    local_858 = in_XMM4_Qa;
    local_848 = in_XMM5_Qa;
    local_838 = in_XMM6_Qa;
    local_828 = in_XMM7_Qa;
  }
  local_8b8 = in_RDX;
  local_8b0 = in_RCX;
  local_8a8 = in_R8;
  local_8a0 = in_R9;
  ON_StringBuffer::ON_StringBuffer(&local_908,local_818,0x800);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (format != (char *)0x0) {
    local_8e8.reg_save_area = local_8c8;
    local_8e8.overflow_arg_area = &buffer.m_buffer_capacity;
    local_8e8.gp_offset = 0x10;
    local_8e8.fp_offset = 0x30;
    iVar1 = ON_String::FormatVargsIntoBuffer(&local_908,format,&local_8e8);
    if (0 < iVar1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_908.m_buffer);
    }
  }
  ON_StringBuffer::~ON_StringBuffer(&local_908);
  return __return_storage_ptr__;
}

Assistant:

std::string ON_VARGS_FUNC_CDECL ON_std_string_format(const char* format, ...) ON_NOEXCEPT
{
  char stack_buffer[2048];
  ON_StringBuffer buffer(stack_buffer, sizeof(stack_buffer) / sizeof(stack_buffer[0]));
  int n = 0;
  std::string str;

  if ( 0 != format || 0 != format[0] )
  {
    va_list args;
    va_start(args, format);
    n = ON_String::FormatVargsIntoBuffer(buffer, format, args);
    va_end(args);
  }

  if ( n > 0 )
  {
    // exceptions are swallowed.
    try { str.append(buffer.m_buffer, n); }
    catch (const std::exception& ) {}
  }

  return str;
}